

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void bb_uses(dill_stream c,basic_block_conflict bb,int vreg)

{
  char *pcVar1;
  int index;
  int mask;
  uint uVar2;
  
  if (99 < vreg) {
    uVar2 = vreg - 100;
    if (((byte)bb->regs_defined->vec[uVar2 >> 3] >> (uVar2 & 7) & 1) == 0) {
      pcVar1 = bb->regs_used->vec + (uVar2 >> 3);
      *pcVar1 = *pcVar1 | (byte)(1 << ((byte)uVar2 & 7));
    }
    set_used(c,vreg);
    return;
  }
  return;
}

Assistant:

static void
bb_uses(dill_stream c, basic_block bb, int vreg)
{
    if (vreg >= 100) {
        /* not param */
        if (!bit_vec_is_set(bb->regs_defined, vreg - 100)) {
            bit_vec_set(bb->regs_used, vreg - 100);
        }
        set_used(c, vreg);
    }
}